

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Table<unsigned_int,_kj::InsertionOrderIndex> * __thiscall
kj::_::NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>::
emplace<kj::Table<unsigned_int,kj::InsertionOrderIndex>>
          (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>> *this,
          Table<unsigned_int,_kj::InsertionOrderIndex> *params)

{
  if (*this == (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x1) {
    *this = (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x0;
    Table<unsigned_int,_kj::InsertionOrderIndex>::~Table
              ((Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8));
  }
  Table<unsigned_int,_kj::InsertionOrderIndex>::Table
            ((Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8),params);
  *this = (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x1;
  return (Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }